

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeDee.cpp
# Opt level: O2

int TeeDee::SetFloatParameterCallback(UnityAudioEffectState *state,int index,float value)

{
  Data *data;
  int iVar1;
  
  data = (Data *)UnityAudioEffectState::GetEffectData<TeeDee::EffectData>(state);
  if (index < 0x12) {
    data->p[index] = value;
    iVar1 = 0;
    if (index == 0) {
      CalcPattern(data);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK SetFloatParameterCallback(UnityAudioEffectState* state, int index, float value)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        data->p[index] = value;
        if (index == P_SEED)
            CalcPattern(data);
        return UNITY_AUDIODSP_OK;
    }